

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

void __thiscall TPZVec<TPZVec<int>_>::Resize(TPZVec<TPZVec<int>_> *this,int64_t newsize)

{
  void *pvVar1;
  ostream *poVar2;
  int64_t *piVar3;
  TPZVec<int> *pTVar4;
  long lVar5;
  long lVar6;
  TPZVec<int> *pTVar7;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize: ",0x27);
    poVar2 = std::ostream::_M_insert<long>((long)&std::cerr);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::ostream::flush();
  }
  lVar5 = this->fNElements;
  if (lVar5 != newsize) {
    if (newsize == 0) {
      this->fNElements = 0;
      this->fNAlloc = 0;
      pTVar4 = this->fStore;
      if (pTVar4 != (TPZVec<int> *)0x0) {
        lVar5 = pTVar4[-1].fNAlloc;
        if (lVar5 != 0) {
          lVar6 = lVar5 << 5;
          do {
            *(undefined ***)((long)&pTVar4[-1]._vptr_TPZVec + lVar6) = &PTR__TPZVec_0183b5b0;
            pvVar1 = *(void **)((long)pTVar4 + lVar6 + -0x18);
            if (pvVar1 != (void *)0x0) {
              operator_delete__(pvVar1);
            }
            lVar6 = lVar6 + -0x20;
          } while (lVar6 != 0);
        }
        operator_delete__(&pTVar4[-1].fNAlloc,lVar5 << 5 | 8);
      }
      this->fStore = (TPZVec<int> *)0x0;
    }
    else {
      piVar3 = (int64_t *)operator_new__(-(ulong)((ulong)newsize >> 0x3b != 0) | newsize * 0x20 | 8)
      ;
      *piVar3 = newsize;
      pTVar7 = (TPZVec<int> *)(piVar3 + 1);
      pTVar4 = pTVar7;
      do {
        pTVar4->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
        pTVar4->fStore = (int *)0x0;
        pTVar4->fNElements = 0;
        pTVar4->fNAlloc = 0;
        pTVar4 = pTVar4 + 1;
      } while (pTVar4 != (TPZVec<int> *)(piVar3 + newsize * 4 + 1));
      if (newsize <= lVar5) {
        lVar5 = newsize;
      }
      if (0 < lVar5) {
        lVar6 = 0;
        do {
          TPZVec<int>::operator=
                    ((TPZVec<int> *)((long)&pTVar7->_vptr_TPZVec + lVar6),
                     (TPZVec<int> *)((long)&this->fStore->_vptr_TPZVec + lVar6));
          lVar6 = lVar6 + 0x20;
          lVar5 = lVar5 + -1;
        } while (lVar5 != 0);
      }
      pTVar4 = this->fStore;
      if (pTVar4 != (TPZVec<int> *)0x0) {
        lVar5 = pTVar4[-1].fNAlloc;
        if (lVar5 != 0) {
          lVar6 = lVar5 << 5;
          do {
            *(undefined ***)((long)&pTVar4[-1]._vptr_TPZVec + lVar6) = &PTR__TPZVec_0183b5b0;
            pvVar1 = *(void **)((long)pTVar4 + lVar6 + -0x18);
            if (pvVar1 != (void *)0x0) {
              operator_delete__(pvVar1);
            }
            lVar6 = lVar6 + -0x20;
          } while (lVar6 != 0);
        }
        operator_delete__(&pTVar4[-1].fNAlloc,lVar5 << 5 | 8);
      }
      this->fStore = pTVar7;
      this->fNElements = newsize;
      this->fNAlloc = newsize;
    }
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    //	int64_t nlongsize = 2147483647;
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
	}
#ifdef WIN32
	// Parece que o limite no windows é
	int sz = sizeof(T);
	int64_t nlongsize = 1704792168;
	if((newsize+1) > (1./sz)*nlongsize) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		std::cout << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
        //		DebugStop();
        //		return;
	}
#endif
#endif
	
	if(newsize == fNElements) return;
	if (newsize == 0) {
		fNElements = 0;
        fNAlloc = 0;
		delete[] fStore;
		fStore = nullptr;
		return;
	}
	T *newstore = new T[newsize];
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	if(fStore) delete[] fStore;
	fStore = newstore;
	fNElements = newsize;
    fNAlloc = newsize;
}